

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint16_t wirehair::FloorSquareRoot16(uint16_t x)

{
  uint uVar1;
  ushort in_DI;
  uint16_t r;
  uint resultShift;
  uint tableShift;
  uint nonzeroBits;
  uint local_8;
  
  if (in_DI < 0x100) {
    local_8 = 6;
  }
  else {
    local_8 = Log32((uint)in_DI);
  }
  uVar1 = (int)(uint)(byte)kSquareRootTable[(int)(uint)in_DI >> ((char)local_8 - 6U & 0x1e)] >>
          ((byte)(0xf - local_8 >> 1) & 0x1f);
  return (short)uVar1 - (ushort)((int)(uint)in_DI < (int)((uVar1 & 0xffff) * (uVar1 & 0xffff)));
}

Assistant:

uint16_t FloorSquareRoot16(uint16_t x)
{
    unsigned nonzeroBits;
    if (x < 0x100) {
        nonzeroBits = 6;
    }
    else {
        // TBD: It might be faster on ARM to just use branches
        nonzeroBits = Log32(x);
    }

    // See TableGenerator.cpp for logic here
    const unsigned tableShift = (nonzeroBits - 6) & 0xfe;
    const unsigned resultShift = (15 - nonzeroBits) / 2;
    uint16_t r = kSquareRootTable[x >> tableShift] >> resultShift;

    // Correct rounding if necessary (compiler optimizes this form better)
    r -= (r * r > x);

    return r;
}